

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageTctableLiteTest_PackedEnumSmallRange_Test::TestBody
          (GeneratedMessageTctableLiteTest_PackedEnumSmallRange_Test *this)

{
  string_view data;
  bool bVar1;
  RepeatedField<int> *pRVar2;
  char *pcVar3;
  AssertHelper local_128;
  Message local_120;
  int local_118;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  TestPackedEnumSmallRange empty_proto;
  Message local_d0;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  undefined1 local_80 [8];
  TestPackedEnumSmallRange new_proto;
  int local_44;
  undefined1 local_40 [4];
  int i;
  TestPackedEnumSmallRange proto;
  int kNumVals;
  GeneratedMessageTctableLiteTest_PackedEnumSmallRange_Test *this_local;
  
  proto.field_0._impl_._cached_size_.atom_ = (CachedSize)0x3ff;
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)local_40);
  for (local_44 = 0; local_44 < 0x3ff; local_44 = local_44 + 1) {
    proto2_unittest::TestPackedEnumSmallRange::add_vals
              ((TestPackedEnumSmallRange *)local_40,TestPackedEnumSmallRange_NestedEnum_FOO);
  }
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)local_80);
  protobuf::MessageLite::SerializeAsString_abi_cxx11_
            ((string *)&gtest_ar.message_,(MessageLite *)local_40);
  data = (string_view)
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)&gtest_ar.message_);
  protobuf::MessageLite::ParseFromString((MessageLite *)local_80,data);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  pRVar2 = proto2_unittest::TestPackedEnumSmallRange::vals((TestPackedEnumSmallRange *)local_80);
  local_c4 = RepeatedField<int>::Capacity(pRVar2);
  pRVar2 = proto2_unittest::TestPackedEnumSmallRange::vals((TestPackedEnumSmallRange *)local_40);
  local_c8 = RepeatedField<int>::Capacity(pRVar2);
  testing::internal::CmpHelperLT<int,int>
            ((internal *)local_c0,"new_proto.vals().Capacity()","proto.vals().Capacity()",&local_c4,
             &local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty_proto.field_0._impl_._vals_cached_byte_size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x388,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&empty_proto.field_0._impl_._vals_cached_byte_size_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&empty_proto.field_0._impl_._vals_cached_byte_size_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  proto2_unittest::TestPackedEnumSmallRange::TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)&gtest_ar_1.message_);
  pRVar2 = proto2_unittest::TestPackedEnumSmallRange::mutable_vals
                     ((TestPackedEnumSmallRange *)&gtest_ar_1.message_);
  RepeatedField<int>::Reserve(pRVar2,0x3ff);
  pRVar2 = proto2_unittest::TestPackedEnumSmallRange::vals((TestPackedEnumSmallRange *)local_80);
  local_114 = RepeatedField<int>::Capacity(pRVar2);
  pRVar2 = proto2_unittest::TestPackedEnumSmallRange::vals
                     ((TestPackedEnumSmallRange *)&gtest_ar_1.message_);
  local_118 = RepeatedField<int>::Capacity(pRVar2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_110,"new_proto.vals().Capacity()","empty_proto.vals().Capacity()",
             &local_114,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite_test.cc"
               ,0x38e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)&gtest_ar_1.message_);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)local_80);
  proto2_unittest::TestPackedEnumSmallRange::~TestPackedEnumSmallRange
            ((TestPackedEnumSmallRange *)local_40);
  return;
}

Assistant:

TEST(GeneratedMessageTctableLiteTest, PackedEnumSmallRange) {
  // RepeatedField::Reserve(n) may set the capacity to something greater than n,
  // and this "upgrade" algorithm can even be different depending on compiler
  // optimizations!  This value is chosen such that -- with the current
  // implementation of Reserve() -- Reserve(kNumVals) always results in a
  // different final capacity than you'd get by adding elements one at a time.
  constexpr int kNumVals = 1023;
  proto2_unittest::TestPackedEnumSmallRange proto;
  for (int i = 0; i < kNumVals; i++) {
    proto.add_vals(proto2_unittest::TestPackedEnumSmallRange::FOO);
  }

  proto2_unittest::TestPackedEnumSmallRange new_proto;
  new_proto.ParseFromString(proto.SerializeAsString());

  // We should have reserved exactly the right size for new_proto's `vals`,
  // rather than growing it on demand like we did in `proto`.
  EXPECT_LT(new_proto.vals().Capacity(), proto.vals().Capacity());

  // Check that new_proto's capacity is equal to exactly what we'd get from
  // calling Reserve(n).
  proto2_unittest::TestPackedEnumSmallRange empty_proto;
  empty_proto.mutable_vals()->Reserve(kNumVals);
  EXPECT_EQ(new_proto.vals().Capacity(), empty_proto.vals().Capacity());
}